

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Test.h
# Opt level: O2

Result * __thiscall
cppqc::
quickCheckOutput<int,cppqc::detail::null_type,cppqc::detail::null_type,cppqc::detail::null_type,cppqc::detail::null_type>
          (Result *__return_storage_ptr__,cppqc *this,
          Property<int,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type>
          *prop,ostream *out,size_t maxSuccess,size_t maxDiscarded,size_t maxSize,
          duration<double,_std::ratio<1L,_1L>_> shrinkTimeout,SeedType seed)

{
  _Rb_tree_header *p_Var1;
  multimap<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  char cVar2;
  byte bVar3;
  SeedType SVar4;
  ostream *poVar5;
  ulong uVar6;
  mapped_type *pmVar7;
  ostream *poVar8;
  char *pcVar9;
  size_t sVar10;
  Input in;
  long local_1438;
  multimap<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  labels;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  labelsCollected;
  RngEngine rng;
  
  poVar5 = std::operator<<((ostream *)prop,"* Checking property \"");
  (**(code **)(*(long *)this + 8))(&rng,this);
  poVar5 = std::operator<<(poVar5,(string *)&rng);
  poVar5 = std::operator<<(poVar5,"\" ...");
  std::endl<char,std::char_traits<char>>(poVar5);
  std::__cxx11::string::~string((string *)&rng);
  sVar10 = 100;
  if (maxDiscarded != 0) {
    sVar10 = maxDiscarded;
  }
  labelsCollected._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &labelsCollected._M_t._M_impl.super__Rb_tree_header._M_header;
  labelsCollected._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  labelsCollected._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  labelsCollected._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  labelsCollected._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       labelsCollected._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  SVar4 = detail::resolveSeed((SeedType)maxSize);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&rng,(ulong)SVar4);
  p_Var1 = &(__return_storage_ptr__->labels)._M_t._M_impl.super__Rb_tree_header;
  this_00 = &__return_storage_ptr__->labels;
  poVar5 = (ostream *)0x0;
  local_1438 = 0;
  do {
    if (out <= poVar5) {
      detail::convertLabels(&labels,&labelsCollected);
      cVar2 = (*(code *)**(undefined8 **)this)(this);
      if (cVar2 == '\0') {
        poVar8 = std::operator<<((ostream *)prop,"*** Failed! Expected failure but passed ");
        poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
        std::operator<<(poVar8," tests");
        if (local_1438 != 0) {
          poVar8 = std::operator<<((ostream *)prop," (");
          poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
          std::operator<<(poVar8,"% trivial)");
        }
        poVar8 = std::operator<<((ostream *)prop,'.');
        std::endl<char,std::char_traits<char>>(poVar8);
        detail::outputLabels((ostream *)prop,(size_t)poVar5,&labels);
        (__return_storage_ptr__->labels)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
             _S_red;
        (__return_storage_ptr__->labels)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)0x0;
        (__return_storage_ptr__->labels)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &p_Var1->_M_header;
        (__return_storage_ptr__->labels)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             &p_Var1->_M_header;
        (__return_storage_ptr__->labels)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        __return_storage_ptr__->result = QC_NO_EXPECTED_FAILURE;
        __return_storage_ptr__->numTests = (size_t)poVar5;
        std::
        _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator=(&this_00->_M_t,&labels._M_t);
      }
      else {
        poVar8 = std::operator<<((ostream *)prop,"+++ OK, passed ");
        poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
        std::operator<<(poVar8," tests");
        if (local_1438 != 0) {
          poVar8 = std::operator<<((ostream *)prop," (");
          poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
          std::operator<<(poVar8,"% trivial)");
        }
        poVar8 = std::operator<<((ostream *)prop,'.');
        std::endl<char,std::char_traits<char>>(poVar8);
        detail::outputLabels((ostream *)prop,(size_t)poVar5,&labels);
        (__return_storage_ptr__->labels)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
             _S_red;
        (__return_storage_ptr__->labels)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)0x0;
        (__return_storage_ptr__->labels)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &p_Var1->_M_header;
        (__return_storage_ptr__->labels)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             &p_Var1->_M_header;
        (__return_storage_ptr__->labels)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        __return_storage_ptr__->result = QC_SUCCESS;
        __return_storage_ptr__->numTests = (size_t)poVar5;
        std::
        _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator=(&this_00->_M_t,&labels._M_t);
      }
      __return_storage_ptr__->seed = SVar4;
      std::
      _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&labels._M_t);
LAB_00107a4e:
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
      ::~_Rb_tree(&labelsCollected._M_t);
      return __return_storage_ptr__;
    }
    uVar6 = ((long)poVar5 * sVar10) / (ulong)out;
    (**(code **)(**(long **)(this + 8) + 0x10))(&in,*(long **)(this + 8),&rng,uVar6);
    cVar2 = (**(code **)(*(long *)this + 0x30))(this,&in);
    bVar3 = (**(code **)(*(long *)this + 0x20))(this,&in);
    local_1438 = local_1438 + (ulong)bVar3;
    (**(code **)(*(long *)this + 0x28))((key_type *)&labels,this,&in);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
             ::operator[](&labelsCollected,(key_type *)&labels);
    *pmVar7 = *pmVar7 + 1;
    std::__cxx11::string::~string((string *)&labels);
    if (cVar2 == '\0') {
      cVar2 = (*(code *)**(undefined8 **)this)(this);
      pcVar9 = "+++ OK, failed as expected. ";
      if (cVar2 != '\0') {
        pcVar9 = "*** Failed! ";
      }
      std::operator<<((ostream *)prop,pcVar9);
      std::operator<<((ostream *)prop,"Starting shrinking...");
      std::ostream::flush();
      detail::
      doShrink<int,cppqc::detail::null_type,cppqc::detail::null_type,cppqc::detail::null_type,cppqc::detail::null_type>
                ((detail *)&labels,
                 (Property<int,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type>
                  *)this,&in,shrinkTimeout,(ostream *)prop);
      in.super__Tuple_impl<0UL,_int>.super__Head_base<0UL,_int,_false>._M_head_impl =
           (_Tuple_impl<0UL,_int>)
           (_Tuple_impl<0UL,_int>)labels._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
      std::operator<<((ostream *)prop,"done\n");
      poVar8 = std::operator<<((ostream *)prop,"Falsifiable after ");
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
      pcVar9 = " tests";
      if (poVar5 == (ostream *)0x0) {
        pcVar9 = " test";
      }
      std::operator<<(poVar8,pcVar9);
      if (labels._M_t._M_impl._0_8_ != 0) {
        poVar8 = std::operator<<((ostream *)prop," and ");
        poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
        pcVar9 = " shrinks";
        if (labels._M_t._M_impl._0_8_ == 1) {
          pcVar9 = " shrink";
        }
        std::operator<<(poVar8,pcVar9);
      }
      std::operator<<((ostream *)prop," for input:\n");
      printInput<int>((ostream *)prop,&in);
      poVar8 = std::operator<<((ostream *)prop,"(To reproduce the test, use ");
      poVar8 = std::operator<<(poVar8,"CPPQUICKCHECK_SEED");
      poVar8 = std::operator<<(poVar8,'=');
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
      std::operator<<(poVar8,")\n");
      cVar2 = (*(code *)**(undefined8 **)this)(this);
      if (cVar2 == '\0') {
        (__return_storage_ptr__->labels)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
             _S_red;
        (__return_storage_ptr__->labels)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)0x0;
        (__return_storage_ptr__->labels)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &p_Var1->_M_header;
        (__return_storage_ptr__->labels)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             &p_Var1->_M_header;
        (__return_storage_ptr__->labels)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        __return_storage_ptr__->result = QC_SUCCESS;
        __return_storage_ptr__->numTests = (size_t)(poVar5 + 1);
        detail::convertLabels(&labels,&labelsCollected);
        std::
        _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator=(&this_00->_M_t,&labels._M_t);
        std::
        _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree(&labels._M_t);
        __return_storage_ptr__->seed = SVar4;
      }
      else {
        while (pcVar9 = getenv("CPPQUICKCHECK_LOOP_FAILING_TESTS"), pcVar9 != (char *)0x0) {
          std::operator<<((ostream *)prop,"Looping failing test...\n");
          (**(code **)(*(long *)this + 0x30))(this,&in);
        }
        (__return_storage_ptr__->labels)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
             _S_red;
        (__return_storage_ptr__->labels)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)0x0;
        (__return_storage_ptr__->labels)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &p_Var1->_M_header;
        (__return_storage_ptr__->labels)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             &p_Var1->_M_header;
        (__return_storage_ptr__->labels)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        __return_storage_ptr__->result = QC_FAILURE;
        __return_storage_ptr__->numTests = (size_t)(poVar5 + 1);
        detail::convertLabels(&labels,&labelsCollected);
        std::
        _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator=(&this_00->_M_t,&labels._M_t);
        std::
        _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree(&labels._M_t);
        __return_storage_ptr__->seed = SVar4;
        __return_storage_ptr__->numShrinks = labels._M_t._M_impl._0_8_;
        __return_storage_ptr__->usedSize = uVar6;
      }
      goto LAB_00107a4e;
    }
    poVar5 = poVar5 + 1;
  } while( true );
}

Assistant:

Result quickCheckOutput(
    const Property<T0, T1, T2, T3, T4>& prop,
    std::ostream& out = std::cout,
    std::size_t maxSuccess = 100,
    std::size_t maxDiscarded = 0,
    std::size_t maxSize = 0,
    std::chrono::duration<double> shrinkTimeout = DEFAULT_SHRINK_TIMEOUT,
    SeedType seed = USE_DEFAULT_SEED) {
  using Input = typename Property<T0, T1, T2, T3, T4>::Input;

  out << "* Checking property \"" << prop.name() << "\" ..." << std::endl;

  if (maxDiscarded == 0)
    maxDiscarded = maxSuccess * 5;
  if (maxSize == 0)
    maxSize = 100;

  std::map<std::string, std::size_t> labelsCollected;
  std::size_t numSuccess = 0, numDiscarded = 0, numTrivial = 0;

  seed = detail::resolveSeed(seed);
  RngEngine rng{seed};
  while (numSuccess < maxSuccess) {
    std::size_t size = (numSuccess * maxSize + numDiscarded) / maxSuccess;
    Input in = prop.generateInput(rng, size);
    try {
      bool success = false;
      try {
        success = prop.checkInput(in);
      } catch (...) {
        out << "Caught exception checking property...\n";
      }

      if (prop.trivialInput(in))
        ++numTrivial;
      ++labelsCollected[prop.classifyInput(in)];

      if (success) {
        ++numSuccess;
      } else {
        if (prop.expect()) {
          out << "*** Failed! ";
        } else {
          out << "+++ OK, failed as expected. ";
        }

        std::size_t numShrinks = 0;
        try {
          out << "Starting shrinking..." << std::flush;
          std::pair<std::size_t, Input> shrinkRes =
              detail::doShrink(prop, in, shrinkTimeout, out);
          numShrinks = shrinkRes.first;
          in = shrinkRes.second;
          out << "done\n";
        } catch (...) {
          out << "WARN: Aborted shrinking because an exception was thrown\n";
        }
        out << "Falsifiable after " << numSuccess + 1
            << (numSuccess == 0 ? " test" : " tests");
        if (numShrinks > 0) {
          out << " and " << numShrinks
              << (numShrinks == 1 ? " shrink" : " shrinks");
        }
        out << " for input:\n";
        printInput(out, in);
        out << "(To reproduce the test, use " << CPPQUICKCHECK_SEED_ENV << '='
            << seed << ")\n";

        if (prop.expect()) {
          while (getenv(CPPQUICKCHECK_LOOP_FAILING_TESTS_ENV) != nullptr) {
            out << "Looping failing test...\n";
            prop.checkInput(in);
          }
          Result ret;
          ret.result = QC_FAILURE;
          ret.numTests = numSuccess + 1;
          ret.labels = detail::convertLabels(labelsCollected);
          ret.seed = seed;
          ret.numShrinks = numShrinks;
          ret.usedSize = size;
          return ret;
        } else {
          Result ret;
          ret.result = QC_SUCCESS;
          ret.numTests = numSuccess + 1;
          ret.labels = detail::convertLabels(labelsCollected);
          ret.seed = seed;
          return ret;
        }
      }
    } catch (...) {
      if (++numDiscarded >= maxDiscarded) {
        out << "*** Gave up! Passed only " << numSuccess << " tests."
            << std::endl;

        Result ret;
        ret.result = QC_GAVE_UP;
        ret.numTests = numSuccess;
        ret.labels = detail::convertLabels(labelsCollected);
        ret.seed = seed;
        return ret;
      }
    }
  }

  std::multimap<std::size_t, std::string> labels =
      detail::convertLabels(labelsCollected);

  if (prop.expect()) {
    out << "+++ OK, passed " << numSuccess << " tests";
    if (numTrivial != 0)
      out << " (" << (100 * numTrivial / numSuccess) << "% trivial)";
    out << '.' << std::endl;
    detail::outputLabels(out, numSuccess, labels);

    Result ret;
    ret.result = QC_SUCCESS;
    ret.numTests = numSuccess;
    ret.labels = labels;
    ret.seed = seed;
    return ret;
  } else {
    out << "*** Failed! Expected failure but passed " << numSuccess << " tests";
    if (numTrivial != 0)
      out << " (" << (100 * numTrivial / numSuccess) << "% trivial)";
    out << '.' << std::endl;
    detail::outputLabels(out, numSuccess, labels);

    Result ret;
    ret.result = QC_NO_EXPECTED_FAILURE;
    ret.numTests = numSuccess;
    ret.labels = labels;
    ret.seed = seed;
    return ret;
  }
}